

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol_table.cc
# Opt level: O0

shared_ptr<dh::symTab> __thiscall dh::symTab::get_upptr_tab(symTab *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  shared_ptr<dh::symTab> sVar1;
  symTab *this_local;
  
  std::shared_ptr<dh::symTab>::shared_ptr
            ((shared_ptr<dh::symTab> *)this,(shared_ptr<dh::symTab> *)(in_RSI + 8));
  sVar1.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar1.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (shared_ptr<dh::symTab>)sVar1.super___shared_ptr<dh::symTab,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

::std::shared_ptr<symTab> symTab::get_upptr_tab()
{
	return this->upper_tab;
}